

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

void * lj_mem_newgco(lua_State *L,GCSize size)

{
  undefined4 *puVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(L->glref).ptr32;
  *(int *)(uVar2 + 0x18c) = (int)L;
  puVar1 = (undefined4 *)(**(code **)(uVar2 + 0x40))(*(undefined8 *)(uVar2 + 0x48),0,0,(ulong)size);
  if (puVar1 != (undefined4 *)0x0) {
    *(int *)(uVar2 + 0x50) = *(int *)(uVar2 + 0x50) + size;
    *(long *)(uVar2 + 0x98) = *(long *)(uVar2 + 0x98) + (ulong)size;
    *puVar1 = *(undefined4 *)(uVar2 + 0x60);
    *(int *)(uVar2 + 0x60) = (int)puVar1;
    *(byte *)(puVar1 + 1) = *(byte *)(uVar2 + 0x58) & 3;
    return puVar1;
  }
  lj_err_mem(L);
}

Assistant:

void * LJ_FASTCALL lj_mem_newgco(lua_State *L, GCSize size)
{
  global_State *g = G(L);
  GCobj *o;

  setgcref(g->mem_L, obj2gco(L));
  o = (GCobj *)g->allocf(g->allocd, NULL, 0, size);
  if (o == NULL)
    lj_err_mem(L);
  lj_assertG(checkptrGC(o),
	     "allocated memory address %p outside required range", o);
  g->gc.total += size;
  g->gc.allocated += size;
  setgcrefr(o->gch.nextgc, g->gc.root);
  setgcref(g->gc.root, o);
  newwhite(g, o);
  return o;
}